

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToLocalUcs2Little::map_utf8
          (CCharmapToLocalUcs2Little *this,char *dest,size_t dest_len,utf8_ptr src,
          size_t src_byte_len,size_t *src_bytes_used)

{
  wchar_t wVar1;
  utf8_ptr p;
  size_t sVar2;
  
  sVar2 = 0;
  for (p.p_ = src.p_; p.p_ < src.p_ + src_byte_len; p.p_ = utf8_ptr::s_inc(p.p_)) {
    if (dest == (char *)0x0) {
      dest = (char *)0x0;
    }
    else {
      if (dest_len < 2) break;
      wVar1 = utf8_ptr::s_getch(p.p_);
      *(short *)dest = (short)wVar1;
      dest = dest + 2;
      dest_len = dest_len - 2;
    }
    sVar2 = sVar2 + 2;
  }
  if (src_bytes_used != (size_t *)0x0) {
    *src_bytes_used = (long)p.p_ - (long)src.p_;
  }
  return sVar2;
}

Assistant:

size_t CCharmapToLocalUcs2Little::
   map_utf8(char *dest, size_t dest_len,
            utf8_ptr src, size_t src_byte_len,
            size_t *src_bytes_used) const
{
    utf8_ptr src_start;
    size_t cur_total;
    char *srcend;

    /* remember where we started */
    src_start = src;

    /* compute where the source buffer ends */
    srcend = src.getptr() + src_byte_len;

    /* copy characters until we reach the end of the source string */
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting - don't store anything */
        }
        else if (dest_len >= 2)
        {
            wchar_t unicode_char;

            /* get the current character */
            unicode_char = src.getch();

            /* add the sequence */
            *dest++ = (unicode_char & 0xff);
            *dest++ = ((unicode_char >> 8) & 0xff);

            /* adjust the length remaining */
            dest_len -= 2;
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += 2;
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}